

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_36::ConcurrencyLimitingHttpClient::ConnectionCounter::~ConnectionCounter
          (ConnectionCounter *this)

{
  ConcurrencyLimitingHttpClient *pCVar1;
  Disposer *pDVar2;
  PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *pPVar3;
  _Map_pointer ppOVar4;
  uint uVar5;
  int iVar6;
  _Elt_pointer pOVar7;
  ConnectionCounter local_30;
  
  pCVar1 = this->parent;
  if (pCVar1 != (ConcurrencyLimitingHttpClient *)0x0) {
    uVar5 = pCVar1->concurrentRequests - 1;
    pCVar1->concurrentRequests = uVar5;
    if (uVar5 < pCVar1->maxConcurrentRequests) {
      do {
        pOVar7 = (pCVar1->pendingRequests).c.
                 super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        if ((pCVar1->pendingRequests).c.
            super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur == pOVar7) break;
        pDVar2 = pOVar7->disposer;
        pPVar3 = pOVar7->ptr;
        pOVar7->ptr = (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                       *)0x0;
        if (pOVar7 == (pCVar1->pendingRequests).c.
                      super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete((pCVar1->pendingRequests).c.
                          super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          ppOVar4 = (pCVar1->pendingRequests).c.
                    super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node;
          (pCVar1->pendingRequests).c.
          super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node = ppOVar4 + 1;
          pOVar7 = ppOVar4[1];
          (pCVar1->pendingRequests).c.
          super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_first = pOVar7;
          (pCVar1->pendingRequests).c.
          super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_last = pOVar7 + 0x20;
        }
        else {
          pOVar7 = (pCVar1->pendingRequests).c.
                   super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        (pCVar1->pendingRequests).c.
        super__Deque_base<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur = pOVar7;
        iVar6 = (*(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[1])(pPVar3);
        if ((char)iVar6 != '\0') {
          pCVar1->concurrentRequests = pCVar1->concurrentRequests + 1;
          local_30.parent = pCVar1;
          (*(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar3,&local_30);
          ~ConnectionCounter(&local_30);
        }
        (**pDVar2->_vptr_Disposer)
                  (pDVar2,(_func_int *)
                          ((long)&(pPVar3->super_PromiseRejector)._vptr_PromiseRejector +
                          (long)(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[-2]));
      } while (pCVar1->concurrentRequests < pCVar1->maxConcurrentRequests);
    }
    fireCountChanged(this->parent);
  }
  return;
}

Assistant:

~ConnectionCounter() noexcept(false) {
      if (parent != nullptr) {
        --parent->concurrentRequests;
        parent->serviceQueue();
        parent->fireCountChanged();
      }
    }